

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

double __thiscall soplex::SPxSolverBase<double>::maxInfeas(SPxSolverBase<double> *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (this->theType == ENTER) {
    dVar4 = 0.0;
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      dVar4 = this->m_pricingViol + this->m_pricingViolCo;
    }
    uVar1 = (this->thecovectors->set).thenum;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = (this->theFvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
      dVar6 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if (dVar5 <= dVar6) {
        dVar6 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if ((dVar5 < dVar6) && (dVar6 = dVar6 - dVar5, dVar4 <= dVar6)) {
          dVar4 = dVar6;
        }
      }
      else {
        dVar5 = dVar5 - dVar6;
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
      }
    }
  }
  else {
    if (this->m_pricingViolUpToDate == false) {
      dVar4 = 0.0;
    }
    else {
      dVar4 = this->m_pricingViol;
    }
    uVar1 = (this->thecovectors->set).thenum;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = (this->theCoPvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
      dVar6 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if (dVar5 <= dVar6) {
        dVar6 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start[uVar3];
        if ((dVar5 < dVar6) && (dVar6 = dVar6 - dVar5, dVar4 <= dVar6)) {
          dVar4 = dVar6;
        }
      }
      else {
        dVar5 = dVar5 - dVar6;
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
      }
    }
    uVar1 = (this->thevectors->set).thenum;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = (this->thePvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
      dVar6 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if (dVar5 <= dVar6) {
        dVar6 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if ((dVar5 < dVar6) && (dVar6 = dVar6 - dVar5, dVar4 <= dVar6)) {
          dVar4 = dVar6;
        }
      }
      else {
        dVar5 = dVar5 - dVar6;
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
      }
    }
  }
  return dVar4;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }